

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog.hpp
# Opt level: O1

uint64_t bitmanip::detail::approximateGuessTable<64ul>(Table<unsigned_char,_64UL> *table)

{
  uint b;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = 0x21;
  uVar2 = 0;
  do {
    bVar9 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar9) {
      return 0xffffffffffffffff;
    }
    uVar4 = uVar2 | 1L << (uVar1 & 0x3f);
    uVar6 = 0;
    lVar7 = 0;
    do {
      uVar3 = (ulong)table->data[lVar7];
      uVar8 = uVar6 >> 0x20;
      iVar5 = (uint)(uVar8 >= uVar3 && uVar8 != uVar3) - (uint)(uVar8 < uVar3);
      if (iVar5 != 0) goto LAB_00113d96;
      lVar7 = lVar7 + 1;
      uVar6 = uVar6 + uVar4;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_00113d96:
    if (iVar5 == -1) {
      uVar2 = uVar4;
    }
    if (iVar5 == 0) {
      return uVar4;
    }
  } while( true );
}

Assistant:

[[nodiscard]] constexpr std::uint64_t approximateGuessTable(const Table<unsigned char, SIZE> &table) noexcept
{
    std::uint64_t result = 0;
    for (unsigned b = 33; b-- != 0;) {
        std::uint64_t guessedResult = result | (std::uint64_t{1} << b);
        int cmp = compareApproximationToGuessTable(guessedResult, table);
        if (cmp == 0) {
            return guessedResult;
        }
        if (cmp == -1) {
            result = guessedResult;
        }
    }
    return NO_APPROXIMATION;
}